

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void KnuthDiv(uint32_t *u,uint32_t *v,uint32_t *q,uint32_t *r,uint m,uint n)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint *puVar9;
  byte bVar10;
  ulong uVar11;
  bool local_c2;
  bool local_c1;
  int local_a8;
  int local_a4;
  int i_5;
  int i_4;
  uint32_t carry_1;
  uint32_t limit;
  uint i_3;
  bool carry;
  bool isNeg;
  int64_t subres;
  uint64_t p;
  ulong uStack_78;
  uint i_2;
  int64_t borrow;
  uint64_t rp;
  uint64_t qp;
  uint64_t dividend;
  int j;
  uint32_t v_tmp;
  uint i_1;
  uint32_t u_tmp;
  uint i;
  uint32_t u_carry;
  uint32_t v_carry;
  uint shift;
  uint64_t b;
  uint n_local;
  uint m_local;
  uint32_t *r_local;
  uint32_t *q_local;
  uint32_t *v_local;
  uint32_t *u_local;
  
  if (u == (uint32_t *)0x0) {
    __assert_fail("u && \"Must provide dividend\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x4dd,
                  "void KnuthDiv(uint32_t *, uint32_t *, uint32_t *, uint32_t *, unsigned int, unsigned int)"
                 );
  }
  if (v == (uint32_t *)0x0) {
    __assert_fail("v && \"Must provide divisor\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x4de,
                  "void KnuthDiv(uint32_t *, uint32_t *, uint32_t *, uint32_t *, unsigned int, unsigned int)"
                 );
  }
  if (q == (uint32_t *)0x0) {
    __assert_fail("q && \"Must provide quotient\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x4df,
                  "void KnuthDiv(uint32_t *, uint32_t *, uint32_t *, uint32_t *, unsigned int, unsigned int)"
                 );
  }
  bVar3 = false;
  if (((u != v) && (bVar3 = false, u != q)) && (bVar3 = false, v != q)) {
    bVar3 = true;
  }
  if (!bVar3) {
    __assert_fail("u != v && u != q && v != q && \"Must use different memory\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x4e0,
                  "void KnuthDiv(uint32_t *, uint32_t *, uint32_t *, uint32_t *, unsigned int, unsigned int)"
                 );
  }
  if (1 < n) {
    sVar6 = llvm::countLeadingZeros<unsigned_int>(v[n - 1],ZB_Width);
    i = 0;
    u_tmp = 0;
    bVar10 = (byte)sVar6;
    if ((int)sVar6 != 0) {
      for (i_1 = 0; i_1 < m + n; i_1 = i_1 + 1) {
        uVar1 = u[i_1];
        u[i_1] = u[i_1] << (bVar10 & 0x1f) | u_tmp;
        u_tmp = uVar1 >> (0x20 - bVar10 & 0x1f);
      }
      for (j = 0; (uint)j < n; j = j + 1) {
        uVar1 = v[(uint)j];
        v[(uint)j] = v[(uint)j] << (bVar10 & 0x1f) | i;
        i = uVar1 >> (0x20 - bVar10 & 0x1f);
      }
    }
    u[m + n] = u_tmp;
    dividend._0_4_ = m;
    do {
      uVar7 = llvm::Make_64(u[(uint)dividend + n],u[((uint)dividend + n) - 1]);
      uVar8 = uVar7 / v[n - 1];
      if ((uVar8 == 0x100000000) ||
         (uVar11 = (uVar7 % (ulong)v[n - 1] << 0x20) + (ulong)u[((uint)dividend + n) - 2],
         rp = uVar8, uVar11 <= uVar8 * v[n - 2] && uVar8 * v[n - 2] - uVar11 != 0)) {
        rp = uVar8 - 1;
        uVar11 = (ulong)v[n - 1] + uVar7 % (ulong)v[n - 1];
        if ((uVar11 < 0x100000000) &&
           ((rp == 0x100000000 ||
            (uVar11 = (uVar11 << 0x20) + (ulong)u[((uint)dividend + n) - 2],
            uVar11 <= rp * v[n - 2] && rp * v[n - 2] - uVar11 != 0)))) {
          rp = uVar8 - 2;
        }
      }
      uStack_78 = 0;
      for (p._4_4_ = 0; p._4_4_ < n; p._4_4_ = p._4_4_ + 1) {
        uVar1 = v[p._4_4_];
        uVar2 = u[(uint)dividend + p._4_4_];
        uVar4 = llvm::Lo_32(rp * uVar1);
        uVar7 = (uVar2 - uStack_78) - (ulong)uVar4;
        uVar4 = llvm::Lo_32(uVar7);
        u[(uint)dividend + p._4_4_] = uVar4;
        uVar4 = llvm::Hi_32(rp * uVar1);
        uVar5 = llvm::Hi_32(uVar7);
        uStack_78 = (ulong)(uVar4 - uVar5);
      }
      uVar1 = u[(uint)dividend + n];
      uVar4 = llvm::Lo_32(uStack_78);
      u[(uint)dividend + n] = u[(uint)dividend + n] - uVar4;
      uVar4 = llvm::Lo_32(rp);
      q[(int)(uint)dividend] = uVar4;
      if (uVar1 < uStack_78) {
        q[(int)(uint)dividend] = q[(int)(uint)dividend] - 1;
        limit._2_1_ = false;
        for (carry_1 = 0; carry_1 < n; carry_1 = carry_1 + 1) {
          puVar9 = std::min<unsigned_int>(u + ((uint)dividend + carry_1),v + carry_1);
          uVar1 = *puVar9;
          u[(uint)dividend + carry_1] = v[carry_1] + (uint)limit._2_1_ + u[(uint)dividend + carry_1]
          ;
          local_c1 = true;
          if (uVar1 <= u[(uint)dividend + carry_1]) {
            local_c2 = false;
            if (limit._2_1_ != false) {
              local_c2 = u[(uint)dividend + carry_1] == uVar1;
            }
            local_c1 = local_c2;
          }
          limit._2_1_ = local_c1;
        }
        u[(uint)dividend + n] = (uint)limit._2_1_ + u[(uint)dividend + n];
      }
      dividend._0_4_ = (uint)dividend - 1;
    } while (-1 < (int)(uint)dividend);
    if (r != (uint32_t *)0x0) {
      if ((int)sVar6 == 0) {
        for (local_a8 = n - 1; -1 < local_a8; local_a8 = local_a8 + -1) {
          r[local_a8] = u[local_a8];
        }
      }
      else {
        i_5 = 0;
        for (local_a4 = n - 1; -1 < local_a4; local_a4 = local_a4 + -1) {
          r[local_a4] = u[local_a4] >> (bVar10 & 0x1f) | i_5;
          i_5 = u[local_a4] << (0x20 - bVar10 & 0x1f);
        }
      }
    }
    return;
  }
  __assert_fail("n>1 && \"n must be > 1\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x4e1,
                "void KnuthDiv(uint32_t *, uint32_t *, uint32_t *, uint32_t *, unsigned int, unsigned int)"
               );
}

Assistant:

static void KnuthDiv(uint32_t *u, uint32_t *v, uint32_t *q, uint32_t* r,
                     unsigned m, unsigned n) {
  assert(u && "Must provide dividend");
  assert(v && "Must provide divisor");
  assert(q && "Must provide quotient");
  assert(u != v && u != q && v != q && "Must use different memory");
  assert(n>1 && "n must be > 1");

  // b denotes the base of the number system. In our case b is 2^32.
  const uint64_t b = uint64_t(1) << 32;

// The DEBUG macros here tend to be spam in the debug output if you're not
// debugging this code. Disable them unless KNUTH_DEBUG is defined.
#pragma push_macro("LLVM_DEBUG")
#ifndef KNUTH_DEBUG
#undef LLVM_DEBUG
#define LLVM_DEBUG(X)                                                          \
  do {                                                                         \
  } while (false)
#endif

  LLVM_DEBUG(dbgs() << "KnuthDiv: m=" << m << " n=" << n << '\n');
  LLVM_DEBUG(dbgs() << "KnuthDiv: original:");
  LLVM_DEBUG(for (int i = m + n; i >= 0; i--) dbgs() << " " << u[i]);
  LLVM_DEBUG(dbgs() << " by");
  LLVM_DEBUG(for (int i = n; i > 0; i--) dbgs() << " " << v[i - 1]);
  LLVM_DEBUG(dbgs() << '\n');
  // D1. [Normalize.] Set d = b / (v[n-1] + 1) and multiply all the digits of
  // u and v by d. Note that we have taken Knuth's advice here to use a power
  // of 2 value for d such that d * v[n-1] >= b/2 (b is the base). A power of
  // 2 allows us to shift instead of multiply and it is easy to determine the
  // shift amount from the leading zeros.  We are basically normalizing the u
  // and v so that its high bits are shifted to the top of v's range without
  // overflow. Note that this can require an extra word in u so that u must
  // be of length m+n+1.
  unsigned shift = countLeadingZeros(v[n-1]);
  uint32_t v_carry = 0;
  uint32_t u_carry = 0;
  if (shift) {
    for (unsigned i = 0; i < m+n; ++i) {
      uint32_t u_tmp = u[i] >> (32 - shift);
      u[i] = (u[i] << shift) | u_carry;
      u_carry = u_tmp;
    }
    for (unsigned i = 0; i < n; ++i) {
      uint32_t v_tmp = v[i] >> (32 - shift);
      v[i] = (v[i] << shift) | v_carry;
      v_carry = v_tmp;
    }
  }
  u[m+n] = u_carry;

  LLVM_DEBUG(dbgs() << "KnuthDiv:   normal:");
  LLVM_DEBUG(for (int i = m + n; i >= 0; i--) dbgs() << " " << u[i]);
  LLVM_DEBUG(dbgs() << " by");
  LLVM_DEBUG(for (int i = n; i > 0; i--) dbgs() << " " << v[i - 1]);
  LLVM_DEBUG(dbgs() << '\n');

  // D2. [Initialize j.]  Set j to m. This is the loop counter over the places.
  int j = m;
  do {
    LLVM_DEBUG(dbgs() << "KnuthDiv: quotient digit #" << j << '\n');
    // D3. [Calculate q'.].
    //     Set qp = (u[j+n]*b + u[j+n-1]) / v[n-1]. (qp=qprime=q')
    //     Set rp = (u[j+n]*b + u[j+n-1]) % v[n-1]. (rp=rprime=r')
    // Now test if qp == b or qp*v[n-2] > b*rp + u[j+n-2]; if so, decrease
    // qp by 1, increase rp by v[n-1], and repeat this test if rp < b. The test
    // on v[n-2] determines at high speed most of the cases in which the trial
    // value qp is one too large, and it eliminates all cases where qp is two
    // too large.
    uint64_t dividend = Make_64(u[j+n], u[j+n-1]);
    LLVM_DEBUG(dbgs() << "KnuthDiv: dividend == " << dividend << '\n');
    uint64_t qp = dividend / v[n-1];
    uint64_t rp = dividend % v[n-1];
    if (qp == b || qp*v[n-2] > b*rp + u[j+n-2]) {
      qp--;
      rp += v[n-1];
      if (rp < b && (qp == b || qp*v[n-2] > b*rp + u[j+n-2]))
        qp--;
    }
    LLVM_DEBUG(dbgs() << "KnuthDiv: qp == " << qp << ", rp == " << rp << '\n');

    // D4. [Multiply and subtract.] Replace (u[j+n]u[j+n-1]...u[j]) with
    // (u[j+n]u[j+n-1]..u[j]) - qp * (v[n-1]...v[1]v[0]). This computation
    // consists of a simple multiplication by a one-place number, combined with
    // a subtraction.
    // The digits (u[j+n]...u[j]) should be kept positive; if the result of
    // this step is actually negative, (u[j+n]...u[j]) should be left as the
    // true value plus b**(n+1), namely as the b's complement of
    // the true value, and a "borrow" to the left should be remembered.
    int64_t borrow = 0;
    for (unsigned i = 0; i < n; ++i) {
      uint64_t p = uint64_t(qp) * uint64_t(v[i]);
      int64_t subres = int64_t(u[j+i]) - borrow - Lo_32(p);
      u[j+i] = Lo_32(subres);
      borrow = Hi_32(p) - Hi_32(subres);
      LLVM_DEBUG(dbgs() << "KnuthDiv: u[j+i] = " << u[j + i]
                        << ", borrow = " << borrow << '\n');
    }
    bool isNeg = u[j+n] < borrow;
    u[j+n] -= Lo_32(borrow);

    LLVM_DEBUG(dbgs() << "KnuthDiv: after subtraction:");
    LLVM_DEBUG(for (int i = m + n; i >= 0; i--) dbgs() << " " << u[i]);
    LLVM_DEBUG(dbgs() << '\n');

    // D5. [Test remainder.] Set q[j] = qp. If the result of step D4 was
    // negative, go to step D6; otherwise go on to step D7.
    q[j] = Lo_32(qp);
    if (isNeg) {
      // D6. [Add back]. The probability that this step is necessary is very
      // small, on the order of only 2/b. Make sure that test data accounts for
      // this possibility. Decrease q[j] by 1
      q[j]--;
      // and add (0v[n-1]...v[1]v[0]) to (u[j+n]u[j+n-1]...u[j+1]u[j]).
      // A carry will occur to the left of u[j+n], and it should be ignored
      // since it cancels with the borrow that occurred in D4.
      bool carry = false;
      for (unsigned i = 0; i < n; i++) {
        uint32_t limit = std::min(u[j+i],v[i]);
        u[j+i] += v[i] + carry;
        carry = u[j+i] < limit || (carry && u[j+i] == limit);
      }
      u[j+n] += carry;
    }
    LLVM_DEBUG(dbgs() << "KnuthDiv: after correction:");
    LLVM_DEBUG(for (int i = m + n; i >= 0; i--) dbgs() << " " << u[i]);
    LLVM_DEBUG(dbgs() << "\nKnuthDiv: digit result = " << q[j] << '\n');

    // D7. [Loop on j.]  Decrease j by one. Now if j >= 0, go back to D3.
  } while (--j >= 0);

  LLVM_DEBUG(dbgs() << "KnuthDiv: quotient:");
  LLVM_DEBUG(for (int i = m; i >= 0; i--) dbgs() << " " << q[i]);
  LLVM_DEBUG(dbgs() << '\n');

  // D8. [Unnormalize]. Now q[...] is the desired quotient, and the desired
  // remainder may be obtained by dividing u[...] by d. If r is non-null we
  // compute the remainder (urem uses this).
  if (r) {
    // The value d is expressed by the "shift" value above since we avoided
    // multiplication by d by using a shift left. So, all we have to do is
    // shift right here.
    if (shift) {
      uint32_t carry = 0;
      LLVM_DEBUG(dbgs() << "KnuthDiv: remainder:");
      for (int i = n-1; i >= 0; i--) {
        r[i] = (u[i] >> shift) | carry;
        carry = u[i] << (32 - shift);
        LLVM_DEBUG(dbgs() << " " << r[i]);
      }
    } else {
      for (int i = n-1; i >= 0; i--) {
        r[i] = u[i];
        LLVM_DEBUG(dbgs() << " " << r[i]);
      }
    }
    LLVM_DEBUG(dbgs() << '\n');
  }
  LLVM_DEBUG(dbgs() << '\n');

#pragma pop_macro("LLVM_DEBUG")
}